

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O1

bool sc_dt::operator==(sc_signed *u,sc_unsigned *v)

{
  int iVar1;
  
  if (u->sgn != -1) {
    iVar1 = compare_unsigned(u->sgn,u->nbits,u->ndigits,u->digit,v->sgn,v->nbits,v->ndigits,v->digit
                             ,1,0);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool
operator==(const sc_signed& u, const sc_unsigned& v)
{
  if (u.sgn == SC_NEG)
    return false;
  if (compare_unsigned(u.sgn, u.nbits, u.ndigits, u.digit,
                       v.sgn, v.nbits, v.ndigits, v.digit, 1, 0) != 0)
    return false;
  return true;
}